

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O1

double __thiscall
rapidjson::
GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
GetDouble(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          *this)

{
  ushort uVar1;
  Number NVar2;
  
  uVar1 = (this->data_).f.flags;
  if ((uVar1 & 0x10) == 0) {
    __assert_fail("IsNumber()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/../contrib/rapidjson/include/rapidjson/document.h"
                  ,0x6ad,
                  "double rapidjson::GenericValue<rapidjson::UTF8<>>::GetDouble() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                 );
  }
  if ((uVar1 >> 9 & 1) == 0) {
    if ((uVar1 & 0x20) == 0) {
      if ((uVar1 & 0x40) == 0) {
        if ((char)uVar1 < '\0') {
          NVar2.d = (double)*(long *)&this->data_;
        }
        else {
          if ((uVar1 >> 8 & 1) == 0) {
            __assert_fail("(data_.f.flags & kUint64Flag) != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/../contrib/rapidjson/include/rapidjson/document.h"
                          ,0x6b2,
                          "double rapidjson::GenericValue<rapidjson::UTF8<>>::GetDouble() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                         );
          }
          NVar2.d = ((double)CONCAT44(0x45300000,(int)((ulong)*(undefined8 *)&this->data_ >> 0x20))
                    - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)*(undefined8 *)&this->data_) -
                    4503599627370496.0);
        }
      }
      else {
        NVar2.d = (double)(this->data_).s.length;
      }
    }
    else {
      NVar2.d = (double)(int)(this->data_).s.length;
    }
  }
  else {
    NVar2 = (this->data_).n;
  }
  return (double)NVar2.i64;
}

Assistant:

double GetDouble() const {
        RAPIDJSON_ASSERT(IsNumber());
        if ((data_.f.flags & kDoubleFlag) != 0)                return data_.n.d;   // exact type, no conversion.
        if ((data_.f.flags & kIntFlag) != 0)                   return data_.n.i.i; // int -> double
        if ((data_.f.flags & kUintFlag) != 0)                  return data_.n.u.u; // unsigned -> double
        if ((data_.f.flags & kInt64Flag) != 0)                 return static_cast<double>(data_.n.i64); // int64_t -> double (may lose precision)
        RAPIDJSON_ASSERT((data_.f.flags & kUint64Flag) != 0);  return static_cast<double>(data_.n.u64); // uint64_t -> double (may lose precision)
    }